

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_FSA_dns.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 *puVar1;
  int iVar2;
  undefined8 *puVar3;
  long *plVar4;
  void *pvVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  size_t sVar8;
  FILE *__stream;
  int unaff_EBX;
  int unaff_EBP;
  char *pcVar9;
  int iVar10;
  undefined8 uVar11;
  long lVar12;
  long *unaff_R15;
  bool bVar13;
  int retval;
  long *local_1f8;
  int retval_1;
  void *local_1e8;
  undefined4 local_1dc;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  SUNContext ctx;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  sunrealtype t;
  long *local_1a8;
  double local_1a0;
  void *local_198;
  int local_190;
  int qu;
  void *local_188;
  void *local_180;
  sunrealtype local_178;
  long *local_170;
  long *local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  char fname [256];
  
  if (argc < 2) {
LAB_00102865:
    WrongArgs(*argv);
  }
  else {
    unaff_R15 = (long *)argv[1];
    unaff_EBX = strcmp((char *)unaff_R15,"-nosensi");
    uVar11 = 0;
    if (unaff_EBX == 0) {
      local_1dc = 1;
      unaff_EBP = -1;
      goto LAB_001024f4;
    }
    iVar2 = strcmp((char *)unaff_R15,"-sensi");
    unaff_EBP = argc;
    if ((iVar2 != 0) || (argc != 4)) goto LAB_00102865;
    unaff_R15 = (long *)argv[2];
    iVar2 = strcmp((char *)unaff_R15,"sim");
    if (iVar2 == 0) {
      unaff_EBP = 1;
    }
    else {
      iVar2 = strcmp((char *)unaff_R15,"stg");
      if (iVar2 != 0) goto LAB_00102865;
      unaff_EBP = 2;
    }
    pcVar9 = argv[3];
    if (*pcVar9 == 'f') {
      local_1dc = 1;
      if (pcVar9[1] != '\0') goto LAB_00102865;
    }
    else {
      if ((*pcVar9 != 't') || (pcVar9[1] != '\0')) goto LAB_00102865;
      uVar11 = 1;
      local_1dc = 0;
    }
LAB_001024f4:
    retval = SUNContext_Create(0,&ctx);
    iVar2 = check_retval(&retval,"SUNContext_Create",1);
    if (iVar2 != 0) {
      return 1;
    }
    puVar3 = (undefined8 *)malloc(0x20);
    iVar2 = check_retval(puVar3,"malloc",2);
    if (iVar2 != 0) {
      return 1;
    }
    *puVar3 = 0x3fa47ae147ae147b;
    puVar3[1] = 0x40c3880000000000;
    *(undefined4 *)(puVar3 + 2) = 0;
    *(undefined4 *)((long)puVar3 + 0x14) = 0x417c9c38;
    *(undefined4 *)(puVar3 + 3) = 0;
    *(undefined4 *)((long)puVar3 + 0x1c) = 0x3fe00000;
    plVar4 = (long *)N_VNew_Serial(3,ctx);
    iVar2 = check_retval(plVar4,"N_VNew_Serial",0);
    if (iVar2 != 0) {
      return 1;
    }
    puVar7 = *(undefined8 **)(*plVar4 + 0x10);
    *puVar7 = 0x3ff0000000000000;
    puVar7[1] = 0;
    puVar7[2] = 0;
    local_1b8 = puVar3;
    unaff_R15 = (long *)N_VClone(plVar4);
    iVar2 = check_retval(unaff_R15,"N_VNew_Serial",0);
    if (iVar2 != 0) {
      return 1;
    }
    puVar3 = *(undefined8 **)(*unaff_R15 + 0x10);
    *puVar3 = 0x3fb999999999999a;
    puVar3[1] = 0;
    puVar3[2] = 0;
    local_1f8 = plVar4;
    pvVar5 = (void *)IDACreate(ctx);
    local_198 = pvVar5;
    iVar2 = check_retval(pvVar5,"IDACreate",0);
    if (iVar2 != 0) {
      return 1;
    }
    retval = IDAInit(0,pvVar5,res,local_1f8,unaff_R15);
    iVar2 = check_retval(&retval,"IDAInit",1);
    if (iVar2 != 0) {
      return 1;
    }
    local_168 = (long *)N_VClone(local_1f8);
    puVar3 = *(undefined8 **)(*local_168 + 0x10);
    *puVar3 = 0x3e45798ee2308c3a;
    puVar3[1] = 0x3d06849b86a12b9b;
    puVar3[2] = 0x3eb0c6f7a0b5ed8d;
    retval = IDASVtolerances(0xa0b5ed8d,pvVar5);
    iVar2 = check_retval(&retval,"IDASVtolerances",1);
    if (iVar2 != 0) {
      return 1;
    }
    local_170 = (long *)N_VClone(local_1f8);
    puVar1 = *(undefined4 **)(*local_170 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0x3ff00000;
    puVar1[2] = 0;
    puVar1[3] = 0x3ff00000;
    *(undefined8 *)(puVar1 + 4) = 0;
    retval = IDASetId(pvVar5);
    iVar2 = check_retval(&retval,"IDASetId",1);
    if (iVar2 != 0) {
      return 1;
    }
    local_1e8 = pvVar5;
    retval = IDASetUserData(pvVar5,local_1b8);
    iVar2 = check_retval(&retval,"IDASetUserData",1);
    if (iVar2 != 0) {
      return 1;
    }
    pvVar5 = (void *)SUNDenseMatrix(3,3,ctx);
    iVar2 = check_retval(pvVar5,"SUNDenseMatrix",0);
    if (iVar2 != 0) {
      return 1;
    }
    local_180 = pvVar5;
    local_188 = (void *)SUNLinSol_Dense(local_1f8,pvVar5,ctx);
    iVar2 = check_retval(local_188,"SUNLinSol_Dense",0);
    if (iVar2 != 0) {
      return 1;
    }
    retval = IDASetLinearSolver(local_1e8,local_188,local_180);
    iVar2 = check_retval(&retval,"IDASetLinearSolver",1);
    if (iVar2 != 0) {
      return 1;
    }
    puts("\n3-species chemical kinetics problem");
    if (unaff_EBX != 0) {
      local_158 = *local_1b8;
      uStack_150 = local_1b8[1];
      local_148 = local_1b8[2];
      local_1d0 = (undefined8 *)N_VCloneVectorArray(3,local_1f8);
      iVar2 = check_retval(local_1d0,"N_VCloneVectorArray",0);
      if (iVar2 != 0) {
        return 1;
      }
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        N_VConst(0,local_1d0[lVar12]);
      }
      local_1d8 = (undefined8 *)N_VCloneVectorArray(3,local_1f8);
      iVar2 = check_retval(local_1d8,"N_VCloneVectorArray",0);
      if (iVar2 != 0) {
        return 1;
      }
      for (lVar12 = 0; pvVar5 = local_1e8, lVar12 != 3; lVar12 = lVar12 + 1) {
        N_VConst(0,local_1d8[lVar12]);
      }
      retval = IDASensInit(local_1e8,3,unaff_EBP,resS,local_1d0,local_1d8);
      iVar2 = check_retval(&retval,"IDASensInit",1);
      if (iVar2 != 0) {
        return 1;
      }
      retval = IDASensEEtolerances(pvVar5);
      iVar2 = check_retval(&retval,"IDASensEEtolerances",1);
      if (iVar2 != 0) {
        return 1;
      }
      retval = IDASetSensErrCon(pvVar5,uVar11);
      iVar2 = check_retval(&retval,"IDASetSensErrCon",1);
      if (iVar2 != 0) {
        return 1;
      }
      retval = IDASetSensParams(pvVar5,local_1b8,&local_158,0);
      iVar2 = check_retval(&retval,"IDASetSensParams",1);
      if (iVar2 != 0) {
        return 1;
      }
      printf("Sensitivity: YES ");
      pcVar9 = "( STAGGERED +";
      if (unaff_EBP == 1) {
        pcVar9 = "( SIMULTANEOUS +";
      }
      printf(pcVar9);
      pcVar9 = " FULL ERROR CONTROL )";
      if ((char)local_1dc != '\0') {
        pcVar9 = " PARTIAL ERROR CONTROL )";
      }
      goto LAB_00102886;
    }
  }
  local_1d0 = (undefined8 *)0x0;
  pcVar9 = "Sensitivity: NO ";
  local_1d8 = (undefined8 *)0x0;
LAB_00102886:
  local_1c0 = (undefined8 *)0x0;
  printf(pcVar9);
  local_1a8 = (long *)N_VNew_Serial(2,ctx);
  puVar3 = *(undefined8 **)(*local_1a8 + 0x10);
  *puVar3 = 0;
  puVar3[1] = 0;
  IDAQuadInit(local_1e8,rhsQ);
  if (unaff_EBX != 0) {
    local_1c0 = (undefined8 *)N_VCloneVectorArray(3,local_1a8);
    for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
      N_VConst(0,local_1c0[lVar12]);
    }
    IDAQuadSensInit(local_1e8,0,local_1c0);
  }
  pvVar5 = local_1e8;
  iVar10 = 1;
  local_1a0 = 0.4;
  retval = IDACalcIC(local_1e8,1);
  iVar2 = check_retval(&retval,"IDACalcIC",1);
  if (iVar2 == 0) {
    retval = IDAGetConsistentIC(pvVar5,local_1f8,unaff_R15);
    iVar10 = 1;
    iVar2 = check_retval(&retval,"IDAGetConsistentIC",1);
    if (iVar2 == 0) {
      puVar3 = (undefined8 *)N_VGetArrayPointer(local_1f8);
      puts("\n\nConsistent IC:");
      printf("\ty = ");
      printf("%12.4e %12.4e %12.4e \n",(int)*puVar3,puVar3[1],puVar3[2]);
      puVar3 = (undefined8 *)N_VGetArrayPointer(unaff_R15);
      printf("\typ= ");
      printf("%12.4e %12.4e %12.4e \n",(int)*puVar3,puVar3[1],puVar3[2]);
      puVar7 = local_1d0;
      puVar3 = local_1d8;
      if (unaff_EBX != 0) {
        IDAGetSensConsistentIC(local_1e8,local_1d0);
        puVar6 = (undefined8 *)N_VGetArrayPointer(*puVar7);
        printf("                  Sensitivity 1  ");
        printf("\n\ts1 = ");
        printf("%12.4e %12.4e %12.4e \n",(int)*puVar6,puVar6[1],puVar6[2]);
        local_1d8 = puVar3;
        puVar6 = (undefined8 *)N_VGetArrayPointer(*puVar3);
        printf("\ts1\'= ");
        printf("%12.4e %12.4e %12.4e \n",(int)*puVar6,puVar6[1],puVar6[2]);
        printf("                  Sensitivity 2  ");
        puVar6 = (undefined8 *)N_VGetArrayPointer(puVar7[1]);
        printf("\n\ts2 = ");
        printf("%12.4e %12.4e %12.4e \n",(int)*puVar6,puVar6[1],puVar6[2]);
        puVar3 = (undefined8 *)N_VGetArrayPointer(puVar3[1]);
        printf("\ts2\'= ");
        printf("%12.4e %12.4e %12.4e \n",(int)*puVar3,puVar3[1],puVar3[2]);
        printf("                  Sensitivity 3  ");
        puVar3 = (undefined8 *)N_VGetArrayPointer(puVar7[2]);
        printf("\n\ts3 = ");
        printf("%12.4e %12.4e %12.4e \n",(int)*puVar3,puVar3[1],puVar3[2]);
        puVar3 = (undefined8 *)N_VGetArrayPointer(local_1d8[2]);
        printf("\ts3\'= ");
        printf("%12.4e %12.4e %12.4e \n",(int)*puVar3,puVar3[1],puVar3[2]);
      }
      puts("\n");
      printf("===========================================");
      puts("============================");
      printf("     T     Q       H      NST           y1");
      puts("           y2           y3    ");
      printf("===========================================");
      puts("============================");
      local_190 = 0xc;
      while (bVar13 = local_190 != 0, local_190 = local_190 + -1, bVar13) {
        retval = IDASolve(SUB84(local_1a0,0),local_1e8,&t,local_1f8,unaff_R15,1);
        iVar2 = check_retval(&retval,"IDASolve",1);
        if (iVar2 != 0) break;
        local_178 = t;
        puVar3 = (undefined8 *)N_VGetArrayPointer(local_1f8);
        pvVar5 = local_1e8;
        retval_1 = IDAGetNumSteps(local_1e8,fname);
        check_retval(&retval_1,"IDAGetNumSteps",1);
        retval_1 = IDAGetLastOrder(pvVar5,&qu);
        check_retval(&retval_1,"IDAGetLastOrder",1);
        retval_1 = IDAGetLastStep(pvVar5,&local_160);
        check_retval(&retval_1,"IDAGetLastStep",1);
        printf("%8.3e %2d  %8.3e %5ld\n",SUB84(local_178,0),local_160,(ulong)(uint)qu,fname._0_8_);
        printf("                  Solution       ");
        printf("%12.4e %12.4e %12.4e \n",(int)*puVar3,puVar3[1],puVar3[2]);
        if (unaff_EBX != 0) {
          retval = IDAGetSens(local_1e8,&t,local_1d0);
          iVar2 = check_retval(&retval,"IDAGetSens",1);
          puVar3 = local_1d0;
          if (iVar2 != 0) break;
          puVar7 = (undefined8 *)N_VGetArrayPointer(*local_1d0);
          printf("                  Sensitivity 1  ");
          printf("%12.4e %12.4e %12.4e \n",(int)*puVar7,puVar7[1],puVar7[2]);
          puVar7 = (undefined8 *)N_VGetArrayPointer(puVar3[1]);
          printf("                  Sensitivity 2  ");
          printf("%12.4e %12.4e %12.4e \n",(int)*puVar7,puVar7[1],puVar7[2]);
          puVar3 = (undefined8 *)N_VGetArrayPointer(puVar3[2]);
          printf("                  Sensitivity 3  ");
          printf("%12.4e %12.4e %12.4e \n",(int)*puVar3,puVar3[1],puVar3[2]);
        }
        printf("-----------------------------------------");
        puts("------------------------------");
        local_1a0 = local_1a0 * 10.0;
      }
      puts("\nQuadrature:");
      plVar4 = local_1a8;
      IDAGetQuad(local_1e8,&t,local_1a8);
      printf("G:      %10.4e\n",(int)**(undefined8 **)(*plVar4 + 0x10));
      pvVar5 = local_198;
      puVar3 = local_1c0;
      if (unaff_EBX == 0) {
        puts("\nFinal Statistics:");
        pvVar5 = local_198;
        retval = IDAPrintAllStats(local_198,_stdout,0);
        builtin_strncpy(fname,"idasRoberts_FSA_dns_stats",0x1a);
      }
      else {
        IDAGetQuadSens(local_198,&t,local_1c0);
        printf("\nSensitivities at t=%g:\n",t._0_4_);
        printf("dG/dp1: %11.4e\n",(int)**(undefined8 **)(*(long *)*puVar3 + 0x10));
        printf("dG/dp1: %11.4e\n",(int)**(undefined8 **)(*(long *)puVar3[1] + 0x10));
        printf("dG/dp1: %11.4e\n",(int)**(undefined8 **)(*(long *)puVar3[2] + 0x10));
        puts("\nFinal Statistics:");
        retval = IDAPrintAllStats(pvVar5,_stdout,0);
        builtin_strncpy(fname,"idasRoberts_FSA_dns_stats",0x1a);
        sVar8 = strlen(fname);
        if (unaff_EBP == 1) {
          builtin_strncpy(fname + sVar8,"_-sensi_sim",0xc);
        }
        else {
          builtin_strncpy(fname + sVar8,"_-sensi_stg",0xc);
        }
        sVar8 = strlen(fname);
        pcVar9 = fname + sVar8;
        if ((char)local_1dc == '\0') {
          fname[sVar8 + 2] = '\0';
          pcVar9[0] = '_';
          pcVar9[1] = 't';
        }
        else {
          fname[sVar8 + 2] = '\0';
          pcVar9[0] = '_';
          pcVar9[1] = 'f';
        }
      }
      sVar8 = strlen(fname);
      builtin_strncpy(fname + sVar8,".csv",5);
      __stream = fopen(fname,"w");
      retval = IDAPrintAllStats(pvVar5,__stream,1);
      fclose(__stream);
      N_VDestroy(local_1f8);
      N_VDestroy(unaff_R15);
      N_VDestroy(local_168);
      N_VDestroy(local_170);
      N_VDestroy(local_1a8);
      if (unaff_EBX != 0) {
        N_VDestroyVectorArray(local_1d0,3);
        N_VDestroyVectorArray(local_1d8,3);
        N_VDestroyVectorArray(local_1c0,3);
      }
      free(local_1b8);
      IDAFree(&local_198);
      SUNLinSolFree(local_188);
      SUNMatDestroy(local_180);
      SUNContext_Free(&ctx);
      iVar10 = 0;
    }
  }
  return iVar10;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext ctx;
  void* ida_mem;
  SUNMatrix A;
  SUNLinearSolver LS;
  UserData data;
  sunrealtype reltol, t, tout;
  N_Vector y, yp, abstol, id;
  int iout, retval;
  FILE* FID;
  char fname[256];

  sunrealtype pbar[NS];
  int is;
  N_Vector *yS, *ypS;
  sunbooleantype sensi, err_con;
  int sensi_meth;

  N_Vector yQ, *yQS;

  ida_mem = NULL;
  A       = NULL;
  LS      = NULL;
  data    = NULL;
  y       = NULL;
  yS      = NULL;
  ypS     = NULL;
  yQS     = NULL;

  /* Process arguments */
  ProcessArgs(argc, argv, &sensi, &sensi_meth, &err_con);

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* User data structure */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }
  data->p[0] = SUN_RCONST(0.040);
  data->p[1] = SUN_RCONST(1.0e4);
  data->p[2] = SUN_RCONST(3.0e7);
  data->coef = SUN_RCONST(0.5);

  /* Initial conditions */
  y = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  Ith(y, 1) = ONE;
  Ith(y, 2) = ZERO;
  Ith(y, 3) = ZERO;

  yp = N_VClone(y);
  if (check_retval((void*)yp, "N_VNew_Serial", 0)) { return (1); }

  /* These initial conditions are NOT consistent. See IDACalcIC below. */
  Ith(yp, 1) = SUN_RCONST(0.1);
  Ith(yp, 2) = ZERO;
  Ith(yp, 3) = ZERO;

  /* Create IDAS object */
  ida_mem = IDACreate(ctx);
  if (check_retval((void*)ida_mem, "IDACreate", 0)) { return (1); }

  /* Allocate space for IDAS */
  retval = IDAInit(ida_mem, res, T0, y, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  /* Specify scalar relative tol. and vector absolute tol. */
  reltol         = SUN_RCONST(1.0e-6);
  abstol         = N_VClone(y);
  Ith(abstol, 1) = SUN_RCONST(1.0e-8);
  Ith(abstol, 2) = SUN_RCONST(1.0e-14);
  Ith(abstol, 3) = SUN_RCONST(1.0e-6);
  retval         = IDASVtolerances(ida_mem, reltol, abstol);
  if (check_retval(&retval, "IDASVtolerances", 1)) { return (1); }

  /* Set ID vector */
  id         = N_VClone(y);
  Ith(id, 1) = 1.0;
  Ith(id, 2) = 1.0;
  Ith(id, 3) = 0.0;
  retval     = IDASetId(ida_mem, id);
  if (check_retval(&retval, "IDASetId", 1)) { return (1); }

  /* Attach user data */
  retval = IDASetUserData(ida_mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(y, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(ida_mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  printf("\n3-species chemical kinetics problem\n");

  /* Sensitivity-related settings */
  if (sensi)
  {
    pbar[0] = data->p[0];
    pbar[1] = data->p[1];
    pbar[2] = data->p[2];

    yS = N_VCloneVectorArray(NS, y);
    if (check_retval((void*)yS, "N_VCloneVectorArray", 0)) { return (1); }
    for (is = 0; is < NS; is++) { N_VConst(ZERO, yS[is]); }

    ypS = N_VCloneVectorArray(NS, y);
    if (check_retval((void*)ypS, "N_VCloneVectorArray", 0)) { return (1); }
    for (is = 0; is < NS; is++) { N_VConst(ZERO, ypS[is]); }

    /*
    * Only non-zero sensitivity I.C. are ypS[0]:
    * - Ith(ypS[0],1) = -ONE;
    * - Ith(ypS[0],2) =  ONE;
    *
    * They are not set. IDACalcIC also computes consistent IC for sensitivities.
    */

    retval = IDASensInit(ida_mem, NS, sensi_meth, resS, yS, ypS);
    if (check_retval(&retval, "IDASensInit", 1)) { return (1); }

    retval = IDASensEEtolerances(ida_mem);
    if (check_retval(&retval, "IDASensEEtolerances", 1)) { return (1); }

    retval = IDASetSensErrCon(ida_mem, err_con);
    if (check_retval(&retval, "IDASetSensErrCon", 1)) { return (1); }

    retval = IDASetSensParams(ida_mem, data->p, pbar, NULL);
    if (check_retval(&retval, "IDASetSensParams", 1)) { return (1); }

    printf("Sensitivity: YES ");
    if (sensi_meth == IDA_SIMULTANEOUS) { printf("( SIMULTANEOUS +"); }
    else { printf("( STAGGERED +"); }
    if (err_con) { printf(" FULL ERROR CONTROL )"); }
    else { printf(" PARTIAL ERROR CONTROL )"); }
  }
  else { printf("Sensitivity: NO "); }

  /*----------------------------------------------------------
   *               Q U A D R A T U R E S
   * ---------------------------------------------------------*/
  yQ = N_VNew_Serial(2, ctx);

  Ith(yQ, 1) = 0;
  Ith(yQ, 2) = 0;

  IDAQuadInit(ida_mem, rhsQ, yQ);

  if (sensi)
  {
    yQS = N_VCloneVectorArray(NS, yQ);
    for (is = 0; is < NS; is++) { N_VConst(ZERO, yQS[is]); }

    IDAQuadSensInit(ida_mem, NULL, yQS);
  }

  /* Call IDACalcIC to compute consistent initial conditions. If sensitivity is
     enabled, this function also try to find consistent IC for the sensitivities. */

  retval = IDACalcIC(ida_mem, IDA_YA_YDP_INIT, T1);
  ;
  if (check_retval(&retval, "IDACalcIC", 1)) { return (1); }

  retval = IDAGetConsistentIC(ida_mem, y, yp);
  if (check_retval(&retval, "IDAGetConsistentIC", 1)) { return (1); }

  PrintIC(y, yp);

  if (sensi)
  {
    IDAGetSensConsistentIC(ida_mem, yS, ypS);
    PrintSensIC(y, yp, yS, ypS);
  }

  /* In loop over output points, call IDA, print results, test for error */

  printf("\n\n");
  printf("===========================================");
  printf("============================\n");
  printf("     T     Q       H      NST           y1");
  printf("           y2           y3    \n");
  printf("===========================================");
  printf("============================\n");

  for (iout = 1, tout = T1; iout <= NOUT; iout++, tout *= TMULT)
  {
    retval = IDASolve(ida_mem, tout, &t, y, yp, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { break; }

    PrintOutput(ida_mem, t, y);

    if (sensi)
    {
      retval = IDAGetSens(ida_mem, &t, yS);
      if (check_retval(&retval, "IDAGetSens", 1)) { break; }
      PrintSensOutput(yS);
    }
    printf("-----------------------------------------");
    printf("------------------------------\n");
  }

  printf("\nQuadrature:\n");
  IDAGetQuad(ida_mem, &t, yQ);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("G:      %10.4Le\n", Ith(yQ, 1));
#else
  printf("G:      %10.4e\n", Ith(yQ, 1));
#endif

  if (sensi)
  {
    IDAGetQuadSens(ida_mem, &t, yQS);
#if defined(SUNDIALS_EXTENDED_PRECISION)
    printf("\nSensitivities at t=%Lg:\n", t);
    printf("dG/dp1: %11.4Le\n", Ith(yQS[0], 1));
    printf("dG/dp1: %11.4Le\n", Ith(yQS[1], 1));
    printf("dG/dp1: %11.4Le\n", Ith(yQS[2], 1));
#else
    printf("\nSensitivities at t=%g:\n", t);
    printf("dG/dp1: %11.4e\n", Ith(yQS[0], 1));
    printf("dG/dp1: %11.4e\n", Ith(yQS[1], 1));
    printf("dG/dp1: %11.4e\n", Ith(yQS[2], 1));
#endif
  }

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = IDAPrintAllStats(ida_mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  strcpy(fname, "idasRoberts_FSA_dns_stats");
  if (sensi)
  {
    if (sensi_meth == IDA_SIMULTANEOUS) { strcat(fname, "_-sensi_sim"); }
    else { strcat(fname, "_-sensi_stg"); }
    if (err_con) { strcat(fname, "_t"); }
    else { strcat(fname, "_f"); }
  }
  strcat(fname, ".csv");
  FID    = fopen(fname, "w");
  retval = IDAPrintAllStats(ida_mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* Free memory */
  N_VDestroy(y);
  N_VDestroy(yp);
  N_VDestroy(abstol);
  N_VDestroy(id);
  N_VDestroy(yQ);
  if (sensi)
  {
    N_VDestroyVectorArray(yS, NS);
    N_VDestroyVectorArray(ypS, NS);
    N_VDestroyVectorArray(yQS, NS);
  }
  free(data);
  IDAFree(&ida_mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNContext_Free(&ctx);

  return (0);
}